

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_ntop.c
# Opt level: O1

int sock_pton(char *cp,sockaddr *sa)

{
  char cVar1;
  addrinfo *paVar2;
  int iVar3;
  ushort **ppuVar4;
  void *pvVar5;
  char *__name;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  char *__service;
  char *__s;
  size_t sVar9;
  addrinfo *servinfo;
  addrinfo *local_70;
  addrinfo local_68;
  
  if (sa == (sockaddr *)0x0 || cp == (char *)0x0) {
    return -1;
  }
  ppuVar4 = __ctype_b_loc();
  __s = cp;
  do {
    pcVar8 = __s;
    __s = pcVar8 + 1;
    cp = cp + 1;
  } while ((*(byte *)((long)*ppuVar4 + (long)*pcVar8 * 2 + 1) & 0x20) != 0);
  if (*pcVar8 == '[') {
    sVar9 = 0xffffffffffffffff;
    pcVar8 = __s;
    while( true ) {
      if (pcVar8[-1] == '\0') {
        return -2;
      }
      if (pcVar8[-1] == ']') break;
      pcVar8 = pcVar8 + 1;
      sVar9 = sVar9 + 1;
    }
    pvVar5 = memchr(__s,0,sVar9);
    sVar7 = (long)pvVar5 - (long)cp;
    if (pvVar5 == (void *)0x0) {
      sVar7 = sVar9;
    }
    __name = (char *)malloc(sVar7 + 1);
    if (__name != (char *)0x0) {
      memcpy(__name,__s,sVar7 + 1);
      __name[sVar7] = '\0';
    }
  }
  else {
    __name = (char *)0x0;
    __s = pcVar8;
  }
  sVar9 = (long)pcVar8 - (long)__s;
  __service = (char *)0x0;
  do {
    cVar1 = *pcVar8;
    if (cVar1 == ':') {
      pcVar6 = pcVar8 + 1;
      if ((__service != (char *)0x0) && (pcVar6 = __service, __name == (char *)0x0)) break;
    }
    else {
      pcVar6 = __service;
      if (cVar1 == '\0') goto LAB_00106b2d;
    }
    sVar9 = sVar9 + 1;
    __service = pcVar6;
    pcVar8 = pcVar8 + 1;
  } while( true );
  __name = strdup(__s);
  __service = (char *)0x0;
LAB_00106b2d:
  if (__name == (char *)0x0) {
    if (__service == (char *)0x0 || cVar1 != '\0') {
      pvVar5 = memchr(__s,0,sVar9);
      sVar7 = (long)pvVar5 - (long)__s;
      if (pvVar5 == (void *)0x0) {
        sVar7 = sVar9;
      }
    }
    else {
      if ((long)__service - (long)__s < 2) {
        __name = (char *)0x0;
        goto LAB_00106bbd;
      }
      sVar9 = ((long)__service - (long)__s) - 1;
      pvVar5 = memchr(__s,0,sVar9);
      sVar7 = (long)pvVar5 - (long)__s;
      if (pvVar5 == (void *)0x0) {
        sVar7 = sVar9;
      }
    }
    __name = (char *)malloc(sVar7 + 1);
    if (__name != (char *)0x0) {
      memcpy(__name,__s,sVar7 + 1);
      __name[sVar7] = '\0';
    }
  }
LAB_00106bbd:
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 2;
  local_68.ai_protocol = 0;
  local_68.ai_flags = 8;
  local_68.ai_family = 0;
  iVar3 = getaddrinfo(__name,__service,&local_68,&local_70);
  paVar2 = local_70;
  if (iVar3 != 0) {
    sock_pton_cold_1();
    return -2;
  }
  do {
    if (paVar2 == (addrinfo *)0x0) {
LAB_00106c38:
      freeaddrinfo(local_70);
      if (__name != (char *)0x0) {
        free(__name);
        return 0;
      }
      return 0;
    }
    if ((paVar2->ai_family | 8U) == 10) {
      sVar9 = 0x10;
      if (paVar2->ai_addr->sa_family == 10) {
        sVar9 = 0x1c;
      }
      memcpy(sa,paVar2->ai_addr,sVar9);
      if (__name == (char *)0x0) {
        if (paVar2->ai_family == 10) {
          sa[1].sa_data[2] = '\0';
          sa[1].sa_data[3] = '\0';
          sa[1].sa_data[4] = '\0';
          sa[1].sa_data[5] = '\0';
          sa[1].sa_data[6] = '\0';
          sa[1].sa_data[7] = '\0';
          sa[1].sa_data[8] = '\0';
          sa[1].sa_data[9] = '\0';
          *(undefined8 *)(sa[1].sa_data + 10) = 0;
          sa->sa_data[6] = '\0';
          sa->sa_data[7] = '\0';
          sa->sa_data[8] = '\0';
          sa->sa_data[9] = '\0';
          sa->sa_data[10] = '\0';
          sa->sa_data[0xb] = '\0';
          sa->sa_data[0xc] = '\0';
          sa->sa_data[0xd] = '\0';
          sa[1].sa_family = 0;
          sa[1].sa_data[0] = '\0';
          sa[1].sa_data[1] = '\0';
          sa[1].sa_data[2] = '\0';
          sa[1].sa_data[3] = '\0';
          sa[1].sa_data[4] = '\0';
          sa[1].sa_data[5] = '\0';
        }
        else {
          if (paVar2->ai_family != 2) {
            return -2;
          }
          sa->sa_data[2] = '\0';
          sa->sa_data[3] = '\0';
          sa->sa_data[4] = '\0';
          sa->sa_data[5] = '\0';
        }
      }
      goto LAB_00106c38;
    }
    paVar2 = paVar2->ai_next;
  } while( true );
}

Assistant:

int sock_pton(const char *cp, struct sockaddr *sa) {
    const char *ip_end;
    char *host_name = NULL;
    const char *port = NULL;
    if ((!cp) || (!sa)) {
        return -1;
    }

    // skip ws
    while ((cp) && (isspace(*cp))) {
        ++cp;
    }

    ip_end = cp;
    if (*cp == '[') { // find matching bracket ']'
        ++cp;
        while ((*ip_end) && (*ip_end != ']')) {
            ++ip_end;
        }

        if (!*ip_end) {
            return -2;
        }
        host_name = strndup(cp, ip_end - cp);
        ++ip_end;
    }
    { // find start of port part
        while (*ip_end) {
            if (*ip_end == ':') {
                if (!port) {
                    port = ip_end + 1;
                } else if (host_name == NULL) { // means addr has [] block
                    port = NULL; // more than 1 ":" => assume the whole addr is
                                 // IPv6 address w/o port
                    host_name = strdup(cp);
                    break;
                }
            }
            ++ip_end;
        }
        if (!host_name) {
            if ((*ip_end == 0) && (port != NULL)) {
                if (port - cp > 1) { // only port entered
                    host_name = strndup(cp, port - cp - 1);
                }
            } else {
                host_name = strndup(cp, ip_end - cp);
            }
        }
    }

    // getaddrinfo for host
    {
        struct addrinfo hints, *servinfo, *p;
        int rv;

        memset(&hints, 0, sizeof hints);
        hints.ai_family = AF_UNSPEC;
        hints.ai_socktype = SOCK_DGRAM;
        hints.ai_flags = AI_V4MAPPED;

        if ((rv = getaddrinfo(host_name, port, &hints, &servinfo)) != 0) {
            fprintf(stderr, "getaddrinfo: %s\n", gai_strerror(rv));
            if (host_name)
                free(host_name);
            return -2;
        }

        for (p = servinfo; p != NULL; p = p->ai_next) {
            if ((p->ai_family == AF_INET) || (p->ai_family == AF_INET6)) {
                memcpy(sa, p->ai_addr, SA_LEN(p->ai_addr));
                if (host_name == NULL) { // getaddrinfo returns localhost ip if
                                         // hostname is null
                    switch (p->ai_family) {
                    case AF_INET:
                        ((struct sockaddr_in *)sa)->sin_addr.s_addr =
                            INADDR_ANY;
                        break;
                    case AF_INET6:
                        memset(&((struct sockaddr_in6 *)sa)->sin6_addr, 0,
                               sizeof(struct sockaddr_in6));
                        break;
                    default: // Should never happen LCOV_EXCL_START
                        if (host_name)
                            free(host_name);
                        return -2;
                    } // LCOV_EXCL_STOP
                }
                break;
            }
        }
        freeaddrinfo(servinfo);
    }

    if (host_name)
        free(host_name);
    return 0;
}